

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::CheckTypeAndMergeFrom
          (TreeEnsembleClassifier *this,MessageLite *from)

{
  int iVar1;
  ulong uVar2;
  LogMessage *other;
  TreeEnsembleParameters *this_00;
  StringVector *this_01;
  Int64Vector *this_02;
  undefined1 *puVar3;
  Arena *pAVar4;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__TreeEnsembleClassifier_0048f398) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::TreeEnsembleClassifier *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((TreeEnsembleClassifier *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x5bc);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  puVar3 = (undefined1 *)from[1]._vptr_MessageLite;
  if ((TreeEnsembleParameters *)puVar3 != (TreeEnsembleParameters *)0x0 &&
      from != (MessageLite *)_TreeEnsembleClassifier_default_instance_) {
    this_00 = this->treeensemble_;
    if (this_00 == (TreeEnsembleParameters *)0x0) {
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      this_00 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::TreeEnsembleParameters>(pAVar4);
      this->treeensemble_ = this_00;
      puVar3 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    if ((TreeEnsembleParameters *)puVar3 == (TreeEnsembleParameters *)0x0) {
      puVar3 = _TreeEnsembleParameters_default_instance_;
    }
    TreeEnsembleParameters::MergeFrom(this_00,(TreeEnsembleParameters *)puVar3);
  }
  iVar1 = (int)from[1]._internal_metadata_.ptr_;
  if (iVar1 != 0) {
    this->postevaluationtransform_ = iVar1;
  }
  iVar1 = *(int *)((long)&from[2]._internal_metadata_.ptr_ + 4);
  if (iVar1 != 0x65) {
    if (iVar1 != 100) goto LAB_002c80a5;
    if (this->_oneof_case_[0] == 100) {
      this_01 = (this->ClassLabels_).stringclasslabels_;
LAB_002c804e:
      puVar3 = (undefined1 *)from[2]._vptr_MessageLite;
    }
    else {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 100;
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                          (pAVar4);
      (this->ClassLabels_).stringclasslabels_ = this_01;
      if (*(int *)((long)&from[2]._internal_metadata_.ptr_ + 4) == 100) goto LAB_002c804e;
      puVar3 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom(this_01,(StringVector *)puVar3);
    goto LAB_002c80a5;
  }
  if (this->_oneof_case_[0] == 0x65) {
    this_02 = (this->ClassLabels_).int64classlabels_;
LAB_002c8085:
    puVar3 = (undefined1 *)from[2]._vptr_MessageLite;
  }
  else {
    clear_ClassLabels(this);
    this->_oneof_case_[0] = 0x65;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar4 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar4 = *(Arena **)pAVar4;
    }
    this_02 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                        (pAVar4);
    (this->ClassLabels_).int64classlabels_ = this_02;
    if (*(int *)((long)&from[2]._internal_metadata_.ptr_ + 4) == 0x65) goto LAB_002c8085;
    puVar3 = _Int64Vector_default_instance_;
  }
  Int64Vector::MergeFrom(this_02,(Int64Vector *)puVar3);
LAB_002c80a5:
  uVar2 = (from->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}